

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O2

WJTL_STATUS TestStrings(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  WJTL_STATUS WVar9;
  WJTL_STATUS WVar10;
  WJTL_STATUS WVar11;
  WJTL_STATUS WVar12;
  WJTL_STATUS WVar13;
  WJTL_STATUS WVar14;
  JL_STATUS JVar15;
  JL_STATUS JVar16;
  JL_STATUS JVar17;
  WJTL_STATUS WVar18;
  WJTL_STATUS WVar19;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  char *local_40;
  JlDataObject *stringObject;
  
  WVar1 = VerifyOutputString("string","\"string\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"string\", \"\\\"string\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x102);
  WVar2 = VerifyOutputString(anon_var_dwarf_425 + 10,"null",false);
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\", \"null\", 0 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x103);
  WVar3 = VerifyOutputString((char *)0x0,"null",false);
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( ((void*)0), \"null\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x104);
  WVar4 = VerifyOutputString(" string ","\" string \"",false);
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \" string \", \"\\\" string \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x106);
  WVar5 = VerifyOutputString(" ","\" \"",false);
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \" \", \"\\\" \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x107);
  WVar6 = VerifyOutputString("it\'s","\"it\'s\"",false);
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"it\'s\", \"\\\"it\'s\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x108);
  WVar7 = VerifyOutputString("\n","\"\\n\"",false);
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\n\", \"\\\"\\\\n\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x109);
  WVar8 = VerifyOutputString("\x01\x02\x03\x04\x05\x06\a\b",
                             "\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\"",false);
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x01\\x02\\x03\\x04\\x05\\x06\\x07\\x08\", \"\\\"\\\\u0001\\\\u0002\\\\u0003\\\\u0004\\\\u0005\\\\u0006\\\\u0007\\\\b\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10a);
  WVar9 = VerifyOutputString("\t\n\v\f\r\x0e\x0f\x10","\"\\t\\n\\u000b\\f\\r\\u000e\\u000f\\u0010\""
                             ,false);
  WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x09\\x0a\\x0b\\x0c\\x0d\\x0e\\x0f\\x10\", \"\\\"\\\\t\\\\n\\\\u000b\\\\f\\\\r\\\\u000e\\\\u000f\\\\u0010\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10b);
  WVar10 = VerifyOutputString("\x11\x12\x13\x14\x15\x16\x17\x18",
                              "\"\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\"",false);
  WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x11\\x12\\x13\\x14\\x15\\x16\\x17\\x18\", \"\\\"\\\\u0011\\\\u0012\\\\u0013\\\\u0014\\\\u0015\\\\u0016\\\\u0017\\\\u0018\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10c);
  WVar11 = VerifyOutputString("\x19\x1a\x1b\x1c\x1d\x1e\x1f ",
                              "\"\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f \"",false);
  WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x19\\x1a\\x1b\\x1c\\x1d\\x1e\\x1f\\x20\", \"\\\"\\\\u0019\\\\u001a\\\\u001b\\\\u001c\\\\u001d\\\\u001e\\\\u001f \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10d);
  WVar12 = VerifyOutputString("_\"_","\"_\\\"_\"",false);
  WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"_\\\"_\", \"\\\"_\\\\\\\"_\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10f);
  WVar13 = VerifyOutputString("_\\_","\"_\\\\_\"",false);
  WjTestLib_Assert(WVar13 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"_\\\\_\", \"\\\"_\\\\\\\\_\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x110);
  WVar14 = VerifyOutputString(anon_var_dwarf_4cd,anon_var_dwarf_94fa,false);
  WjTestLib_Assert(WVar14 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\xF0\\x9F\\x98\\x81\", \"\\\"\\xF0\\x9F\\x98\\x81\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x111);
  stringObject = (JlDataObject *)0x0;
  local_40 = (char *)0x0;
  JVar15 = JlCreateObject(JL_DATA_TYPE_STRING,&stringObject);
  WjTestLib_Assert(JVar15 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlCreateObject( JL_DATA_TYPE_STRING, &stringObject ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xed);
  JVar16 = JlSetObjectString(stringObject,anon_var_dwarf_951c);
  WjTestLib_Assert(JVar16 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlSetObjectString( stringObject, String ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xee);
  JVar17 = JlOutputJson(stringObject,false,&local_40);
  Condition = JVar17 == JL_STATUS_INVALID_DATA;
  WjTestLib_Assert(Condition,
                   "(JlOutputJson( stringObject, 0, &jsonString )) == (JL_STATUS_INVALID_DATA)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xef);
  Condition_00 = local_40 == (char *)0x0;
  WjTestLib_Assert(Condition_00,"(jsonString) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xf0);
  JVar17 = JlFreeObjectTree(&stringObject);
  Condition_01 = JVar17 == JL_STATUS_SUCCESS;
  WjTestLib_Assert(Condition_01,
                   "((JL_STATUS)(JlFreeObjectTree( &stringObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xf1);
  WjTestLib_Assert((Condition_01 && Condition_00) &&
                   (Condition && (JVar16 == JL_STATUS_SUCCESS && JVar15 == JL_STATUS_SUCCESS)),
                   "((JL_STATUS)(VerifyInvalidString( \"\\xF0\\x9F\\x98Truncated\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x113);
  WVar18 = VerifyOutputString("it\'s","\'it\\\'s\'",true);
  WjTestLib_Assert(WVar18 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"it\'s\", \"\'it\\\\\'s\'\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x116);
  WVar19 = WJTL_STATUS_SUCCESS;
  if ((((WVar13 != WJTL_STATUS_SUCCESS || WVar14 != WJTL_STATUS_SUCCESS) ||
       WVar18 != WJTL_STATUS_SUCCESS) ||
      ((WVar11 != WJTL_STATUS_SUCCESS || WVar12 != WJTL_STATUS_SUCCESS) ||
      (WVar10 != WJTL_STATUS_SUCCESS || WVar9 != WJTL_STATUS_SUCCESS))) ||
      ((((WVar5 != WJTL_STATUS_SUCCESS || WVar6 != WJTL_STATUS_SUCCESS) ||
        WVar7 != WJTL_STATUS_SUCCESS) ||
       ((WVar3 != WJTL_STATUS_SUCCESS || WVar4 != WJTL_STATUS_SUCCESS) ||
       (WVar2 != WJTL_STATUS_SUCCESS || WVar1 != WJTL_STATUS_SUCCESS))) ||
      WVar8 != WJTL_STATUS_SUCCESS)) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_01 || !Condition_00) ||
      (!Condition || (JVar16 != JL_STATUS_SUCCESS || JVar15 != JL_STATUS_SUCCESS))) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  return WVar19;
}

Assistant:

static
WJTL_STATUS
    TestStrings
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test valid strings
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "   \"SingleString\"   ", "SingleString" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"SingleString\"", "SingleString" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"Single'String\"", "Single'String" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"a\"", "a" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\"", NULL ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\n\"", "\n" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\" \\b \\n \\r \\\" \\\\ \\f \\t \\/ \"", " \b \n \r \" \\ \f \t / " ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\" \\u0000 \"", " \xc0\x80 " ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\u0000\\u0001\\u0002\\u0003 \\u0004\\u0005\\u0006\\u0007\"", "\xc0\x80\x01\x02\x03 \x04\x05\x06\x07" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\u0008\\u0009\\u000a\\u000b \\u000c\\u000d\\u000e\\u000f\"", "\b\t\n\x0b \x0c\r\x0e\x0f" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\u0010\\u0011\\u0012\\u0013 \\u0014\\u0015\\u0016\\u0017\"", "\x10\x11\x12\x13 \x14\x15\x16\x17" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\u0018\\u0019\\u001a\\u001b \\u001c\\u001d\\u001e\\u001f\"", "\x18\x19\x1a\x1b \x1c\x1d\x1e\x1f" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\ud83d\\ude01\"", "\xF0\x9F\x98\x81" ) );    // smiley face emoji
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\uD83D\\ude01\"", "\xF0\x9F\x98\x81" ) );    // smiley face emoji
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\ud83d\\uDE01\"", "\xF0\x9F\x98\x81" ) );    // smiley face emoji
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\uD83D\\uDE01\"", "\xF0\x9F\x98\x81" ) );    // smiley face emoji
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "null", NULL ) );

    // Test valid objects that are not strings
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "1234" ) );
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "true" ) );
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "false" ) );
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "{ \"Dictionary\" : \"String\" }" ) );
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "[ \"List\" ]" ) );

    // Test valid json5 strings
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "'SingleString'", "SingleString" ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "'Single\"String'", "Single\"String" ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"Split\\\nString\"", "SplitString" ) );  // escaped new line in string
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"Split\\\r\\\nString\"", "SplitString" ) );  // fully escaped cr and lf in string
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"Windows\\\r\nNewLine\"", "WindowsNewLine" ) );  // windows escaped crlf
    }

    // Test invalid strings
    if( !IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 'SingleString' ", 1 ) );
    }
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\t\n \"SingleString' ", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "    SingleString ", 4 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"Single\nString\"", 7 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " \"SingleString'", 1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 'SingleString\"", 1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " \"Noend", 1 ) );

    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"Windows\\\n\rCRLF Wrong\"", 10 ) );  // don't allow single escaped LF CR (wrong order)

    // Check doesn't allow a string following a string
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"Single\" \"String\"", 8 ) );
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "'Single' 'String'", 8 ) );
    }

    // Test invalid escapes
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\a6789\"", 5 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\x11 6789\"", 5 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\Ud83d\\Ude01\"", 5 ) );    // uppercase \U
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\Ud83d\\ude01\"", 5 ) );    // uppercase \U
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\ud83dXX\"", 5 ) ); // Too short for second surrogate
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\ud83dXXXXXXX\"", 5 ) ); // Missing second surrogate
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\ud83d\\ud83dXX\"", 5 ) ); // Second surrogate not low
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\ude01\\ud83dXX\"", 5 ) ); // surrogates swapped (low first)

    return TestReturn;
}